

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O0

void timer_inc(int n,uint32_t clocks,uint32_t remainder)

{
  uint clocks_00;
  gba_interrupt_t in_EDX;
  int in_ESI;
  uint in_EDI;
  uint32_t new_value;
  ulong in_stack_ffffffffffffffe8;
  
  clocks_00 = (uint)bus->TMINT[(int)in_EDI].value + in_ESI;
  while (0xffff < clocks_00) {
    clocks_00 = (uint)bus->TMCNT_L[(int)in_EDI].raw + (clocks_00 - 0xffff);
    if (((in_EDI != 3) && ((bus->TMCNT_H[0].raw >> 2 & 1) != 0)) &&
       ((bus->TMCNT_H[0].raw >> 7 & 1) != 0)) {
      timer_inc(in_EDX,clocks_00,(uint32_t)(in_stack_ffffffffffffffe8 >> 0x20));
    }
    if ((bus->TMCNT_H[(int)in_EDI].raw >> 6 & 1) != 0) {
      in_stack_ffffffffffffffe8 = (ulong)in_EDI;
      switch(in_stack_ffffffffffffffe8) {
      case 0:
        request_interrupt(in_EDX);
        break;
      case 1:
        request_interrupt(in_EDX);
        break;
      case 2:
        request_interrupt(in_EDX);
        break;
      case 3:
        request_interrupt(in_EDX);
      }
    }
    if ((in_EDI == 0) || (in_EDI == 1)) {
      sound_timer_overflow
                ((gba_apu_t *)CONCAT44(in_EDX,clocks_00),(int)(in_stack_ffffffffffffffe8 >> 0x20));
    }
  }
  bus->TMINT[(int)in_EDI].value = (uint16_t)clocks_00;
  bus->TMINT[(int)in_EDI].ticks = (uint16_t)in_EDX;
  return;
}

Assistant:

void timer_inc(int n, word clocks, word remainder) {
    word new_value = bus->TMINT[n].value + clocks;

    while (new_value > 0xFFFF) {
        new_value = bus->TMCNT_L[n].timer_reload + (new_value - 0xFFFF);

        if (n != 3 && bus->TMCNT_H->cascade && bus->TMCNT_H->start) {
            timer_inc(n + 1, 1, 0);
        }

        if (bus->TMCNT_H[n].timer_irq_enable) {
            switch (n) {
                case 0:
                    request_interrupt(IRQ_TIMER0);
                    break;
                case 1:
                    request_interrupt(IRQ_TIMER1);
                    break;
                case 2:
                    request_interrupt(IRQ_TIMER2);
                    break;
                case 3:
                    request_interrupt(IRQ_TIMER3);
                    break;
            }
        }

        if (n == 0 || n == 1) {
            sound_timer_overflow(apu, n);
        }
    }
    bus->TMINT[n].value = new_value;
    bus->TMINT[n].ticks = remainder;
}